

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

void __thiscall diy::FileStorage::FileStorage(FileStorage *this,string *filename_template)

{
  _Rb_tree_header *p_Var1;
  allocator_type local_9;
  
  (this->super_ExternalStorage)._vptr_ExternalStorage = (_func_int **)&PTR_put_00148378;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->filename_templates_,1,filename_template,&local_9);
  p_Var1 = &(this->filenames_).x_._M_t._M_impl.super__Rb_tree_header;
  (this->filenames_).x_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->filenames_).x_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->filenames_).x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->filenames_).x_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->filenames_).x_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->filenames_).m_.mLock = 0;
  (this->max_size_).x_ = 0;
  (this->max_size_).m_.mLock = 0;
  (this->count_).x_ = 0;
  (this->count_).m_ = 0;
  (this->current_size_).x_ = 0;
  (this->current_size_).m_.mLock = 0;
  return;
}

Assistant:

FileStorage(const std::string& filename_template = "/tmp/DIY.XXXXXX"):
                      filename_templates_(1, filename_template),
                      count_(0), current_size_(0), max_size_(0)         {}